

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

void absl::anon_unknown_2::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  uint128 other;
  uint128 rhs;
  uint128 lhs;
  uint128 rhs_00;
  uint128 lhs_00;
  uint128 rhs_01;
  uint128 lhs_01;
  uint128 lhs_02;
  uint128 v;
  uint128 v_00;
  uint64_t uVar1;
  bool bVar2;
  type_conflict1 tVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint128 v_01;
  uint128 v_02;
  uint128 local_1f8;
  uint64_t local_1e8;
  uint64_t local_1e0;
  uint64_t local_1d8;
  uint64_t local_1d0;
  uint64_t local_1c8;
  uint64_t local_1c0;
  int local_1ac;
  uint64_t uStack_1a8;
  int i;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  int local_17c;
  undefined1 auStack_178 [4];
  int shift;
  uint128 quotient;
  uint128 denominator;
  uint128 local_118;
  uint128 *local_108;
  uint64_t local_100;
  uint128 *local_f8;
  uint128 *remainder_ret_local;
  uint128 *quotient_ret_local;
  uint128 divisor_local;
  uint128 dividend_local;
  uint64_t low_1;
  uint64_t hi_1;
  int local_6c;
  uint64_t low;
  uint64_t hi;
  int local_c;
  
  local_100 = divisor.hi_;
  local_108 = (uint128 *)divisor.lo_;
  v_01.lo_ = dividend.hi_;
  divisor_local.hi_ = dividend.lo_;
  local_f8 = remainder_ret;
  remainder_ret_local = quotient_ret;
  quotient_ret_local = local_108;
  divisor_local.lo_ = local_100;
  uint128::uint128(&local_118,0);
  lhs_02.hi_ = local_100;
  lhs_02.lo_ = (uint64_t)local_108;
  bVar2 = operator!=(lhs_02,local_118);
  if (!bVar2) {
    __assert_fail("divisor != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                  ,0x3a,
                  "void absl::(anonymous namespace)::DivModImpl(uint128, uint128, uint128 *, uint128 *)"
                 );
  }
  lhs_01.hi_ = divisor_local.lo_;
  lhs_01.lo_ = (uint64_t)quotient_ret_local;
  rhs_01.hi_ = v_01.lo_;
  rhs_01.lo_ = divisor_local.hi_;
  bVar2 = operator>(lhs_01,rhs_01);
  if (bVar2) {
    uint128::operator=(remainder_ret_local,0);
    local_f8->lo_ = divisor_local.hi_;
    local_f8->hi_ = v_01.lo_;
  }
  else {
    lhs_00.hi_ = divisor_local.lo_;
    lhs_00.lo_ = (uint64_t)quotient_ret_local;
    rhs_00.hi_ = v_01.lo_;
    rhs_00.lo_ = divisor_local.hi_;
    bVar2 = absl::operator==(lhs_00,rhs_00);
    uVar1 = divisor_local.lo_;
    if (bVar2) {
      uint128::operator=(remainder_ret_local,1);
      uint128::operator=(local_f8,0);
    }
    else {
      quotient.hi_ = (uint64_t)quotient_ret_local;
      memset(auStack_178,0,0x10);
      uVar5 = divisor_local.hi_;
      local_198 = divisor_local.hi_;
      v_01.hi_ = extraout_RDX;
      local_190 = v_01.lo_;
      uVar4 = Uint128High64((absl *)divisor_local.hi_,v_01);
      if (uVar4 == 0) {
        v_00.hi_ = v_01.lo_;
        v_00.lo_ = uVar5;
        uVar5 = Uint128Low64(v_00);
        if (uVar5 == 0) {
          __assert_fail("low != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                        ,0x31,"int absl::(anonymous namespace)::Fls128(uint128)");
        }
        tVar3 = countl_zero<unsigned_long>(uVar5);
        local_c = 0x3f - tVar3;
        uVar5 = extraout_RDX_01;
      }
      else {
        if (uVar4 == 0) {
          __assert_fail("hi != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                        ,0x2d,"int absl::(anonymous namespace)::Fls128(uint128)");
        }
        tVar3 = countl_zero<unsigned_long>(uVar4);
        local_c = 0x7f - tVar3;
        uVar5 = extraout_RDX_00;
      }
      uVar4 = quotient.hi_;
      uStack_1a8 = quotient.hi_;
      local_1a0 = uVar1;
      v_02.hi_ = uVar5;
      v_02.lo_ = uVar1;
      uVar5 = Uint128High64((absl *)quotient.hi_,v_02);
      if (uVar5 == 0) {
        v.hi_ = uVar1;
        v.lo_ = uVar4;
        uVar5 = Uint128Low64(v);
        if (uVar5 == 0) {
          __assert_fail("low != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                        ,0x31,"int absl::(anonymous namespace)::Fls128(uint128)");
        }
        tVar3 = countl_zero<unsigned_long>(uVar5);
        local_6c = 0x3f - tVar3;
      }
      else {
        if (uVar5 == 0) {
          __assert_fail("hi != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                        ,0x2d,"int absl::(anonymous namespace)::Fls128(uint128)");
        }
        tVar3 = countl_zero<unsigned_long>(uVar5);
        local_6c = 0x7f - tVar3;
      }
      local_17c = local_c - local_6c;
      uint128::operator<<=((uint128 *)&quotient.hi_,local_17c);
      for (local_1ac = 0; local_1ac <= local_17c; local_1ac = local_1ac + 1) {
        uint128::operator<<=((uint128 *)auStack_178,1);
        local_1c8 = divisor_local.hi_;
        local_1d8 = quotient.hi_;
        local_1d0 = uVar1;
        lhs.hi_ = v_01.lo_;
        lhs.lo_ = divisor_local.hi_;
        rhs.hi_ = uVar1;
        rhs.lo_ = quotient.hi_;
        local_1c0 = v_01.lo_;
        bVar2 = operator>=(lhs,rhs);
        if (bVar2) {
          local_1e8 = quotient.hi_;
          local_1e0 = uVar1;
          other.hi_ = uVar1;
          other.lo_ = quotient.hi_;
          uint128::operator-=((uint128 *)&divisor_local.hi_,other);
          uint128::uint128(&local_1f8,1);
          uint128::operator|=((uint128 *)auStack_178,local_1f8);
        }
        uint128::operator>>=((uint128 *)&quotient.hi_,1);
      }
      remainder_ret_local->lo_ = _auStack_178;
      remainder_ret_local->hi_ = quotient.lo_;
      local_f8->lo_ = divisor_local.hi_;
      local_f8->hi_ = v_01.lo_;
    }
  }
  return;
}

Assistant:

inline void DivModImpl(uint128 dividend, uint128 divisor, uint128* quotient_ret,
                       uint128* remainder_ret) {
  assert(divisor != 0);

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  const int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  for (int i = 0; i <= shift; ++i) {
    quotient <<= 1;
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= 1;
    }
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}